

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArrayPrimitiveType.h
# Opt level: O2

void __thiscall
COLLADAFW::ArrayPrimitiveType<COLLADAFW::Transformation_*>::reallocMemory
          (ArrayPrimitiveType<COLLADAFW::Transformation_*> *this,size_t minCapacity)

{
  Transformation **ppTVar1;
  ulong capacity;
  
  if (this->mCapacity < minCapacity) {
    capacity = (this->mCapacity * 3 >> 1) + 1;
    if (capacity <= minCapacity) {
      capacity = minCapacity;
    }
    this->mCapacity = capacity;
    if (this->mData == (Transformation **)0x0) {
      allocMemory(this,capacity,this->mFlags);
      return;
    }
    ppTVar1 = (Transformation **)realloc(this->mData,capacity << 3);
    this->mData = ppTVar1;
    if (this->mCapacity < this->mCount) {
      this->mCount = this->mCapacity;
    }
  }
  return;
}

Assistant:

void reallocMemory ( size_t minCapacity )
		{
			if ( minCapacity <= mCapacity)
				return;
			size_t newCapacity = ( mCapacity * 3 ) / 2 + 1;
			if (newCapacity < minCapacity)
				newCapacity = minCapacity;
			mCapacity = newCapacity;

			if ( mData )
			{
				mData = ( Type* ) realloc ( mData, mCapacity * sizeof ( Type ) );
				if ( mCount > mCapacity )
					mCount = mCapacity;
			}
			else
			{
				allocMemory(newCapacity, mFlags);
			}
		}